

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlLoadFileContent(char *filename)

{
  int iVar1;
  ssize_t sVar2;
  xmlChar *content;
  stat info;
  long size;
  int len;
  int fd;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = stat64(filename,(stat64 *)&content);
    if (iVar1 < 0) {
      filename_local = (char *)0x0;
    }
    else {
      iVar1 = open64(filename,0);
      if (iVar1 < 0) {
        filename_local = (char *)0x0;
      }
      else {
        info.__glibc_reserved[2] = info.st_rdev;
        filename_local = (char *)(*xmlMalloc)(info.st_rdev + 10);
        if (filename_local == (char *)0x0) {
          xmlCatalogErrMemory();
          close(iVar1);
          filename_local = (char *)0x0;
        }
        else {
          sVar2 = read(iVar1,filename_local,info.__glibc_reserved[2]);
          close(iVar1);
          if ((int)sVar2 < 0) {
            (*xmlFree)(filename_local);
            filename_local = (char *)0x0;
          }
          else {
            filename_local[(int)sVar2] = '\0';
          }
        }
      }
    }
  }
  return (xmlChar *)filename_local;
}

Assistant:

static xmlChar *
xmlLoadFileContent(const char *filename)
{
    int fd;
    int len;
    long size;

    struct stat info;
    xmlChar *content;

    if (filename == NULL)
        return (NULL);

    if (stat(filename, &info) < 0)
        return (NULL);

    fd = open(filename, O_RDONLY);
    if (fd  < 0)
    {
        return (NULL);
    }
    size = info.st_size;
    content = xmlMalloc(size + 10);
    if (content == NULL) {
        xmlCatalogErrMemory();
	close(fd);
        return (NULL);
    }
    len = read(fd, content, size);
    close(fd);
    if (len < 0) {
        xmlFree(content);
        return (NULL);
    }
    content[len] = 0;

    return(content);
}